

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O1

iterator * __thiscall
st_tree::detail::
node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>
::emplace_insert<int,char_const(&)[2]>
          (iterator *__return_storage_ptr__,void *this,int *args,char (*args_1) [2])

{
  int i;
  long lVar1;
  new_allocator<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>>
  *this_00;
  size_t sVar2;
  node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
  *__args;
  node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1> *__p
  ;
  node_type *n;
  string local_80;
  new_allocator<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>>
  *local_60;
  unsigned_long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  __p = (node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
         *)this;
  node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
  ::tree((node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
          *)this);
  this_00 = (new_allocator<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>>
             *)operator_new(0x88);
  __gnu_cxx::
  new_allocator<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>>
  ::
  construct<st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>,st_tree::detail::node_raw<st_tree::tree<ut_raw::emplace_subnodes::test_method()::str1,st_tree::raw<st_tree::arg_unused>,std::allocator<ut_raw::emplace_subnodes::test_method()::str1>>,ut_raw::emplace_subnodes::test_method()::str1>const&>
            (this_00,__p,__args);
  i = *args;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60 = this_00;
  sVar2 = strlen(*args_1);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,args_1,*args_1 + sVar2);
  ut_raw::emplace_subnodes::test_method()::str1::str1(int,std::__cxx11::string_
            (&local_58,i,&local_80);
  *(undefined4 *)(this_00 + 0x20) = (undefined4)local_58;
  std::__cxx11::string::operator=((string *)(this_00 + 0x28),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_58 = 1;
  max_maintainer<unsigned_long,_std::allocator<str1>_>::insert
            ((max_maintainer<unsigned_long,_std::allocator<str1>_> *)(this_00 + 0x60),&local_58);
  std::
  vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
  ::push_back((vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
               *)((long)this + 0x48),(value_type *)&local_60);
  node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
  ::_graft((node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
            *)this,(node_type *)this_00);
  lVar1 = *(long *)((long)this + 0x50);
  __return_storage_ptr__->_vptr_valmap_iterator_adaptor_random =
       (_func_int **)&PTR__valmap_iterator_adaptor_random_0030e5a8;
  (__return_storage_ptr__->_base)._M_current =
       (node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
        **)(lVar1 + -8);
  return __return_storage_ptr__;
}

Assistant:

iterator emplace_insert(Args&&... args){
        node_type* n = this->tree()._new_node();
        n->_data = data_type(std::forward<Args>(args) ... );
        n->_depth.insert(1);
        this->_children.push_back(n);
        this->_graft(n);
        return iterator(this->_children.begin()+(this->_children.size()-1));
    }